

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::TestHMACSHA256
          (CryptoTest *this,string *hexkey,string *hexin,string *hexout)

{
  long lVar1;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t in_RCX;
  char *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe58;
  size_t in_stack_fffffffffffffe60;
  CHMAC_SHA256 *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  CHMAC_SHA256 *in_stack_ffffffffffffff68;
  CryptoTest *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe78);
  this_01 = (CHMAC_SHA256 *)&stack0xffffffffffffff10;
  hex_str._M_str = in_RDX;
  hex_str._M_len = in_RCX;
  ParseHex<unsigned_char>(hex_str);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      (in_stack_fffffffffffffe58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_fffffffffffffe58);
  CHMAC_SHA256::CHMAC_SHA256(this_01,(uchar *)in_RDI,in_stack_fffffffffffffe60);
  std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  hex_str_00._M_str = in_RDX;
  hex_str_00._M_len = in_RCX;
  ParseHex<unsigned_char>(hex_str_00);
  std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  hex_str_01._M_str = in_RDX;
  hex_str_01._M_len = in_RCX;
  ParseHex<unsigned_char>(hex_str_01);
  TestVector<CHMAC_SHA256,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestHMACSHA256(const std::string &hexkey, const std::string &hexin, const std::string &hexout) {
    std::vector<unsigned char> key = ParseHex(hexkey);
    TestVector(CHMAC_SHA256(key.data(), key.size()), ParseHex(hexin), ParseHex(hexout));
}